

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O1

bool __thiscall
CorUnix::CSimpleHandleManager::ValidateHandle(CSimpleHandleManager *this,HANDLE handle)

{
  bool bVar1;
  ulong uVar2;
  
  if (this->m_rghteHandleTable == (HANDLE_TABLE_ENTRY *)0x0) {
    bVar1 = false;
    fprintf(_stderr,"] %s %s:%d","ValidateHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handlemgr.cpp"
            ,0x116);
    fprintf(_stderr,"Handle Manager is not initialized!\n");
  }
  else if (((long)handle - 0xffffff01U < 5) &&
          ((0x15UL >> ((long)handle - 0xffffff01U & 0x3f) & 1) != 0)) {
    bVar1 = false;
    fprintf(_stderr,"] %s %s:%d","ValidateHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handlemgr.cpp"
            ,0x12a);
    fprintf(_stderr,"Handle %p is a special handle, returning FALSE.\n",handle);
  }
  else if (((long)handle + 1U < 2) ||
          ((uVar2 = ((ulong)handle >> 2) - 1, this->m_dwTableSize <= (uint)uVar2 ||
           (bVar1 = true, this->m_rghteHandleTable[uVar2 & 0xffffffff].fEntryAllocated == false))))
  {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CSimpleHandleManager::ValidateHandle(HANDLE handle)
{
    DWORD dwIndex;
    
    if (NULL == m_rghteHandleTable)
    {
        ASSERT("Handle Manager is not initialized!\n");
        return FALSE;
    }
    
    if (handle == INVALID_HANDLE_VALUE || handle == 0)
    {
        TRACE( "INVALID_HANDLE_VALUE or NULL value is not a valid handle.\n" );
        return FALSE;
    }

    if (HandleIsSpecial(handle))
    {
        //
        // Special handles are valid in the general sense. They are not valid
        // in this context, though, as they were not allocated by the handle
        // manager. Hitting this case indicates a logic error within the PAL
        // (since clients of the handle manager should have already dealt with
        // the specialness of the handle) so we assert here.
        //
        
        ASSERT ("Handle %p is a special handle, returning FALSE.\n", handle);
        return FALSE;
    }

    dwIndex = HandleToHandleIndex(handle);

    if (dwIndex >= m_dwTableSize)
    {
        WARN( "The handle value(%p) is out of the bounds for the handle table.\n", handle );
        return FALSE;
    }

    if (!m_rghteHandleTable[dwIndex].fEntryAllocated)
    {
        WARN("The handle value (%p) has not been allocated\n", handle);
        return FALSE;
    }

    return TRUE;
}